

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O3

void __thiscall
duckdb::LocalStorage::Commit
          (LocalStorage *this,optional_ptr<duckdb::StorageCommitState,_true> commit_state)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __node_base _Var1;
  reference_map_t<DataTable,_shared_ptr<LocalTableStorage>_> table_storage;
  _Hashtable<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_50;
  
  LocalTableManager::MoveEntries
            ((reference_map_t<DataTable,_shared_ptr<LocalTableStorage>_> *)&local_50,
             &this->table_manager);
  for (_Var1._M_nxt = local_50._M_before_begin._M_nxt; _Var1._M_nxt != (_Hash_node_base *)0x0;
      _Var1._M_nxt = (_Var1._M_nxt)->_M_nxt) {
    Flush(this,(DataTable *)_Var1._M_nxt[1]._M_nxt,(LocalTableStorage *)_Var1._M_nxt[2]._M_nxt,
          commit_state);
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var1._M_nxt[3]._M_nxt;
    _Var1._M_nxt[2]._M_nxt = (_Hash_node_base *)0x0;
    _Var1._M_nxt[3]._M_nxt = (_Hash_node_base *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_50);
  return;
}

Assistant:

void LocalStorage::Commit(optional_ptr<StorageCommitState> commit_state) {
	// commit local storage
	// iterate over all entries in the table storage map and commit them
	// after this, the local storage is no longer required and can be cleared
	auto table_storage = table_manager.MoveEntries();
	for (auto &entry : table_storage) {
		auto table = entry.first;
		auto storage = entry.second.get();
		Flush(table, *storage, commit_state);
		entry.second.reset();
	}
}